

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSAPublicKey.cpp
# Opt level: O0

void __thiscall OSSLDSAPublicKey::setFromOSSL(OSSLDSAPublicKey *this,DSA *inDSA)

{
  undefined8 in_RSI;
  long *in_RDI;
  ByteString inY;
  ByteString inG;
  ByteString inQ;
  ByteString inP;
  BIGNUM *bn_pub_key;
  BIGNUM *bn_g;
  BIGNUM *bn_q;
  BIGNUM *bn_p;
  undefined1 local_e0 [24];
  BIGNUM *in_stack_ffffffffffffff38;
  undefined1 local_b8 [40];
  undefined1 local_90 [56];
  undefined1 local_58 [40];
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  
  local_18 = 0;
  local_20 = 0;
  local_28 = 0;
  local_30 = 0;
  local_10 = in_RSI;
  DSA_get0_pqg(in_RSI,&local_18,&local_20,&local_28);
  DSA_get0_key(local_10,&local_30,0);
  if (local_18 != 0) {
    OSSL::bn2ByteString(in_stack_ffffffffffffff38);
    (**(code **)(*in_RDI + 0x30))(in_RDI,local_58);
    ByteString::~ByteString((ByteString *)0x12a1a9);
  }
  if (local_20 != 0) {
    OSSL::bn2ByteString(in_stack_ffffffffffffff38);
    (**(code **)(*in_RDI + 0x38))(in_RDI,local_90);
    ByteString::~ByteString((ByteString *)0x12a212);
  }
  if (local_28 != 0) {
    OSSL::bn2ByteString(in_stack_ffffffffffffff38);
    (**(code **)(*in_RDI + 0x40))(in_RDI,local_b8);
    ByteString::~ByteString((ByteString *)0x12a278);
  }
  if (local_30 != 0) {
    OSSL::bn2ByteString(in_stack_ffffffffffffff38);
    (**(code **)(*in_RDI + 0x48))(in_RDI,local_e0);
    ByteString::~ByteString((ByteString *)0x12a2d9);
  }
  return;
}

Assistant:

void OSSLDSAPublicKey::setFromOSSL(const DSA* inDSA)
{
	const BIGNUM* bn_p = NULL;
	const BIGNUM* bn_q = NULL;
	const BIGNUM* bn_g = NULL;
	const BIGNUM* bn_pub_key = NULL;

	DSA_get0_pqg(inDSA, &bn_p, &bn_q, &bn_g);
	DSA_get0_key(inDSA, &bn_pub_key, NULL);

	if (bn_p)
	{
		ByteString inP = OSSL::bn2ByteString(bn_p);
		setP(inP);
	}
	if (bn_q)
	{
		ByteString inQ = OSSL::bn2ByteString(bn_q);
		setQ(inQ);
	}
	if (bn_g)
	{
		ByteString inG = OSSL::bn2ByteString(bn_g);
		setG(inG);
	}
	if (bn_pub_key)
	{
		ByteString inY = OSSL::bn2ByteString(bn_pub_key);
		setY(inY);
	}
}